

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemZInstPrinter.c
# Opt level: O1

void printCond4Operand(MCInst *MI,int OpNum,SStream *O)

{
  MCOperand *op;
  int64_t iVar1;
  
  op = MCInst_getOperand(MI,OpNum);
  iVar1 = MCOperand_getImm(op);
  SStream_concat0(O,printCond4Operand_CondNames_rel +
                    *(int *)(getRegisterName_RegAsmOffset + iVar1 * 4 + 0x180));
  if (MI->csh->detail != CS_OPT_OFF) {
    (MI->flat_insn->detail->field_6).arm64.cc = (arm64_cc)iVar1;
  }
  return;
}

Assistant:

static void printCond4Operand(MCInst *MI, int OpNum, SStream *O)
{
	static char *const CondNames[] = {
		"o", "h", "nle", "l", "nhe", "lh", "ne",
		"e", "nlh", "he", "nl", "le", "nh", "no"
	};

	uint64_t Imm = MCOperand_getImm(MCInst_getOperand(MI, OpNum));
	// assert(Imm > 0 && Imm < 15 && "Invalid condition");
	SStream_concat0(O, CondNames[Imm - 1]);

	if (MI->csh->detail)
		MI->flat_insn->detail->sysz.cc = (sysz_cc)Imm;
}